

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O1

Matrix __thiscall maths::Matrix::solve(Matrix *this,Matrix *A,Matrix *b)

{
  int iVar1;
  double **ppdVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  bool bVar6;
  ulong uVar7;
  long lVar8;
  domain_error *this_00;
  long lVar9;
  double **ppdVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  double **ppdVar14;
  ulong uVar15;
  long lVar16;
  double dVar17;
  Matrix MVar18;
  
  uVar12 = (ulong)(uint)A->rows_;
  if (0 < A->rows_) {
    uVar7 = 1;
    lVar8 = 0;
    do {
      ppdVar2 = A->p;
      pdVar3 = ppdVar2[lVar8];
      if ((pdVar3[lVar8] == 0.0) && (!NAN(pdVar3[lVar8]))) {
        this_00 = (domain_error *)__cxa_allocate_exception(0x10);
        std::domain_error::domain_error
                  (this_00,
                   "Error: the coefficient matrix has 0 as a pivot. Please fix the input and try again."
                  );
        __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
      }
      lVar9 = lVar8 + 1;
      if (lVar9 < (int)uVar12) {
        uVar13 = uVar7;
        do {
          uVar15 = uVar7;
          if (lVar9 < A->cols_) {
            do {
              pdVar4 = ppdVar2[uVar13];
              dVar17 = pdVar4[uVar15] - (pdVar4[lVar8] / pdVar3[lVar8]) * pdVar3[uVar15];
              pdVar4[uVar15] = (double)(~-(ulong)(ABS(dVar17) < 1e-10) & (ulong)dVar17);
              uVar15 = uVar15 + 1;
            } while ((int)uVar15 < A->cols_);
          }
          pdVar4 = ppdVar2[uVar13];
          pdVar5 = b->p[uVar13];
          *pdVar5 = *pdVar5 - (pdVar4[lVar8] / pdVar3[lVar8]) * *b->p[lVar8];
          if (ABS(*pdVar4) < 1e-10) {
            *pdVar4 = 0.0;
          }
          pdVar4[lVar8] = 0.0;
          uVar13 = uVar13 + 1;
        } while (uVar13 != (uVar12 & 0xffffffff));
      }
      uVar12 = (ulong)A->rows_;
      uVar7 = uVar7 + 1;
      lVar8 = lVar9;
    } while (lVar9 < (long)uVar12);
  }
  Matrix(this,b->rows_,1);
  iVar1 = this->rows_;
  lVar8 = (long)iVar1;
  ppdVar2 = this->p;
  *ppdVar2[lVar8 + -1] = *b->p[lVar8 + -1] / A->p[lVar8 + -1][lVar8 + -1];
  ppdVar10 = (double **)ppdVar2[lVar8 + -1];
  if (ABS((double)*ppdVar10) < 1e-10) {
    *ppdVar10 = (double *)0x0;
  }
  if (1 < iVar1) {
    ppdVar10 = (double **)(ulong)(iVar1 - 1);
    lVar9 = (long)ppdVar10 * 8;
    ppdVar14 = ppdVar2 + (long)ppdVar10;
    uVar12 = (ulong)(iVar1 - 2);
    do {
      dVar17 = 0.0;
      if ((long)uVar12 < lVar8 + -1) {
        lVar16 = 0;
        iVar11 = 0;
        do {
          iVar11 = (int)(*(double *)((long)A->p[uVar12] + lVar16 * 8 + lVar9) * *ppdVar14[lVar16] +
                        (double)iVar11);
          lVar16 = lVar16 + 1;
        } while ((int)lVar16 + (int)ppdVar10 < iVar1);
        dVar17 = (double)iVar11;
      }
      dVar17 = (*b->p[uVar12] - dVar17) / A->p[uVar12][uVar12];
      *ppdVar2[uVar12] = (double)(~-(ulong)(ABS(dVar17) < 1e-10) & (ulong)dVar17);
      ppdVar10 = (double **)((long)ppdVar10 + -1);
      ppdVar14 = ppdVar14 + -1;
      lVar9 = lVar9 + -8;
      bVar6 = 0 < (long)uVar12;
      uVar12 = uVar12 - 1;
    } while (bVar6);
  }
  MVar18.p = ppdVar10;
  MVar18._0_8_ = this;
  return MVar18;
}

Assistant:

Matrix Matrix::solve(Matrix A, Matrix b)
{
    // Gaussian elimination
    for (int i = 0; i < A.rows_; ++i) {
        if (A.p[i][i] == 0) {
            // pivot 0 - throw error
            throw domain_error("Error: the coefficient matrix has 0 as a pivot. Please fix the input and try again.");
        }
        for (int j = i + 1; j < A.rows_; ++j) {
            for (int k = i + 1; k < A.cols_; ++k) {
                A.p[j][k] -= A.p[i][k] * (A.p[j][i] / A.p[i][i]);
                if (A.p[j][k] < EPS && A.p[j][k] > -1*EPS)
                    A.p[j][k] = 0;
            }
            b.p[j][0] -= b.p[i][0] * (A.p[j][i] / A.p[i][i]);
            if (A.p[j][0] < EPS && A.p[j][0] > -1*EPS)
                A.p[j][0] = 0;
            A.p[j][i] = 0;
        }
    }

    // Back substitution
    Matrix x(b.rows_, 1);
    x.p[x.rows_ - 1][0] = b.p[x.rows_ - 1][0] / A.p[x.rows_ - 1][x.rows_ - 1];
    if (x.p[x.rows_ - 1][0] < EPS && x.p[x.rows_ - 1][0] > -1*EPS)
        x.p[x.rows_ - 1][0] = 0;
    for (int i = x.rows_ - 2; i >= 0; --i) {
        int sum = 0;
        for (int j = i + 1; j < x.rows_; ++j) {
            sum += A.p[i][j] * x.p[j][0];
        }
        x.p[i][0] = (b.p[i][0] - sum) / A.p[i][i];
        if (x.p[i][0] < EPS && x.p[i][0] > -1*EPS)
            x.p[i][0] = 0;
    }

    return x;
}